

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mimics_pcre_test.cc
# Opt level: O0

void re2::MimicsPCRESimpleTests(void)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  LogMessage local_348;
  LogMessage local_1b8;
  StringPiece local_38;
  Regexp *local_28;
  Regexp *re;
  ParseFlags flags;
  int j;
  PCRETest *t;
  int i;
  
  for (t._4_4_ = 0; t._4_4_ < 0x1f; t._4_4_ = t._4_4_ + 1) {
    _flags = (undefined8 *)(tests + (long)t._4_4_ * 0x10);
    for (re._4_4_ = 0; re._4_4_ < 2; re._4_4_ = re._4_4_ + 1) {
      re._0_4_ = LikePerl;
      if (re._4_4_ == 0) {
        re._0_4_ = operator|(LikePerl,Latin1);
      }
      StringPiece::StringPiece(&local_38,(char *)*_flags);
      local_28 = Regexp::Parse(&local_38,(ParseFlags)re,(RegexpStatus *)0x0);
      if (local_28 == (Regexp *)0x0) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/mimics_pcre_test.cc"
                   ,0x43);
        poVar3 = LogMessage::stream(&local_1b8);
        poVar3 = std::operator<<(poVar3,"Check failed: re");
        poVar3 = std::operator<<(poVar3," ");
        std::operator<<(poVar3,(char *)*_flags);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b8);
      }
      bVar1 = *(byte *)(_flags + 1);
      bVar2 = Regexp::MimicsPCRE(local_28);
      if ((bool)(bVar1 & 1) != bVar2) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_348,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/mimics_pcre_test.cc"
                   ,0x44);
        poVar3 = LogMessage::stream(&local_348);
        poVar3 = std::operator<<(poVar3,"Check failed: (t.should_match) == (re->MimicsPCRE())");
        poVar3 = std::operator<<(poVar3," ");
        poVar3 = std::operator<<(poVar3,(char *)*_flags);
        poVar3 = std::operator<<(poVar3," ");
        pcVar4 = "utf";
        if (re._4_4_ == 0) {
          pcVar4 = "latin1";
        }
        std::operator<<(poVar3,pcVar4);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_348);
      }
      Regexp::Decref(local_28);
    }
  }
  return;
}

Assistant:

TEST(MimicsPCRE, SimpleTests) {
  for (int i = 0; i < arraysize(tests); i++) {
    const PCRETest& t = tests[i];
    for (int j = 0; j < 2; j++) {
      Regexp::ParseFlags flags = Regexp::LikePerl;
      if (j == 0)
        flags = flags | Regexp::Latin1;
      Regexp* re = Regexp::Parse(t.regexp, flags, NULL);
      CHECK(re) << " " << t.regexp;
      CHECK_EQ(t.should_match, re->MimicsPCRE())
        << " " << t.regexp << " "
        << (j==0 ? "latin1" : "utf");
      re->Decref();
    }
  }
}